

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observers.h
# Opt level: O0

void __thiscall
obs::observers<Observer>::notify_observers<int>
          (observers<Observer> *this,offset_in_observer_type_to_subr method,int args)

{
  bool bVar1;
  Observer *pOVar2;
  undefined4 in_ECX;
  long *plVar3;
  undefined4 in_register_00000014;
  code *local_c8;
  Observer *observer;
  undefined1 local_90 [8];
  iterator __end0;
  iterator __begin0;
  list_type *__range3;
  int args_local;
  offset_in_observer_type_to_subr method_local;
  observers<Observer> *this_local;
  
  safe_list<Observer>::begin((iterator *)&__end0.m_next_iterator,&this->m_observers);
  safe_list<Observer>::end((iterator *)local_90,&this->m_observers);
  while (bVar1 = safe_list<Observer>::iterator::operator!=
                           ((iterator *)&__end0.m_next_iterator,(iterator *)local_90), bVar1) {
    pOVar2 = safe_list<Observer>::iterator::operator*((iterator *)&__end0.m_next_iterator);
    if (pOVar2 != (Observer *)0x0) {
      plVar3 = (long *)((long)&pOVar2->_vptr_Observer + CONCAT44(in_register_00000014,args));
      local_c8 = (code *)method;
      if ((method & 1) != 0) {
        local_c8 = *(code **)(*plVar3 + (method - 1));
      }
      (*local_c8)(plVar3,in_ECX);
    }
    safe_list<Observer>::iterator::operator++((iterator *)&__end0.m_next_iterator);
  }
  safe_list<Observer>::iterator::~iterator((iterator *)local_90);
  safe_list<Observer>::iterator::~iterator((iterator *)&__end0.m_next_iterator);
  return;
}

Assistant:

void notify_observers(void (observer_type::*method)(Args...), Args ...args) {
    for (auto observer : m_observers) {
      if (observer)
        (observer->*method)(std::forward<Args>(args)...);
    }
  }